

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pred.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::AssertPred1Helper<bool(*)(int),int>
          (AssertionResult *__return_storage_ptr__,iutest *this,char *pred_str,char *expr1,
          _func_bool_int *pred,int val1)

{
  byte bVar1;
  AssertionResult *pAVar2;
  AssertionResult local_58;
  int local_2c;
  char *pcStack_28;
  int val1_local;
  _func_bool_int *pred_local;
  char *expr1_local;
  char *pred_str_local;
  
  local_2c = (int)pred;
  pcStack_28 = expr1;
  pred_local = (_func_bool_int *)pred_str;
  expr1_local = (char *)this;
  pred_str_local = (char *)__return_storage_ptr__;
  bVar1 = (*(code *)expr1)((ulong)pred & 0xffffffff);
  if ((bVar1 & 1) == 0) {
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_58,(char (*) [8])"error: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&expr1_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x5594b5);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&pred_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [29])") evaluates to false, where ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x54ef55);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&pred_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])0x54fe88);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_2c);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    AssertionResult::~AssertionResult(&local_58);
  }
  else {
    AssertionSuccess();
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult AssertPred1Helper(const char* pred_str, const char* expr1
    , PRED pred, T1 val1)
{
    if IUTEST_COND_LIKELY( (*pred)(val1) )
    {
        return AssertionSuccess();
    }
    return AssertionFailure() << "error: " << pred_str << "(" << expr1 << ") evaluates to false, where "
        << "\n" << expr1 << " : " << val1;
}